

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O2

void __thiscall
gurkenlaeufer::detail::
CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_>::CommonStep
          (CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_> *this,
          string *RegEx,BaseHook<(gurkenlaeufer::detail::Hooktype)0> *Step)

{
  list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>
  *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_*>
  local_48;
  
  this->_vptr_CommonStep = (_func_int **)&PTR__CommonStep_001a6ee8;
  (this->_stepContext)._params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stepContext)._params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stepContext)._params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.first.field_2._M_allocated_capacity = 0;
  local_48.first._M_dataplus._M_p = (pointer)0x0;
  local_48.first._M_string_length = 0;
  (this->_stepContext)._currentParamIdx = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  this_00 = (list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>
             *)CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>>::
               getStepRegistry_abi_cxx11_();
  std::__cxx11::string::string((string *)&local_48,(string *)RegEx);
  local_48.second = Step;
  std::__cxx11::
  list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>
  ::
  emplace_back<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>
            (this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

CommonStep(std::string RegEx, TStep* Step)
            : _stepContext({})
        {
            getStepRegistry().emplace_back(std::make_pair(RegEx, Step));
        }